

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_1::Dependency<vkt::api::(anonymous_namespace)::DeviceMemory>::Dependency
          (Dependency<vkt::api::(anonymous_namespace)::DeviceMemory> *this,Environment *env,
          Parameters *params)

{
  Move<vk::Handle<(vk::HandleType)7>_> local_58;
  VkMemoryAllocateInfo local_38;
  
  local_38.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  local_38.pNext = (void *)0x0;
  local_38.allocationSize = params->size;
  local_38.memoryTypeIndex = params->memoryTypeIndex;
  ::vk::allocateMemory(&local_58,env->vkd,env->device,&local_38,env->allocationCallbacks);
  (this->object).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  (this->object).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  (this->object).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  (this->object).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  return;
}

Assistant:

Dependency (const Environment& env, const typename Case::Parameters& params)
		: resources	(env, params)
		, object	(Case::create(env, resources, params))
	{}